

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_buffer.h
# Opt level: O0

iterator __thiscall
r_code::time_buffer<r_exec::CInput,_r_exec::CInput::IsInvalidated>::find
          (time_buffer<r_exec::CInput,_r_exec::CInput::IsInvalidated> *this,uint64_t time_reference,
          CInput *t)

{
  bool bVar1;
  iterator *i_00;
  CInput *this_00;
  iterator iVar2;
  time_buffer<r_exec::CInput,_r_exec::CInput::IsInvalidated> *local_50;
  time_buffer<r_exec::CInput,_r_exec::CInput::IsInvalidated> *local_48;
  undefined1 local_40 [8];
  iterator i;
  CInput *t_local;
  uint64_t time_reference_local;
  time_buffer<r_exec::CInput,_r_exec::CInput::IsInvalidated> *this_local;
  time_buffer<r_exec::CInput,_r_exec::CInput::IsInvalidated> *local_10;
  
  i._cell = (uintptr_t)t;
  iterator::iterator((iterator *)local_40);
  iVar2 = begin(this,time_reference);
  local_50 = iVar2.buffer;
  local_40 = (undefined1  [8])local_50;
  local_48 = (time_buffer<r_exec::CInput,_r_exec::CInput::IsInvalidated> *)iVar2._cell;
  i.buffer = local_48;
  do {
    i_00 = end(this);
    bVar1 = iterator::operator!=((iterator *)local_40,i_00);
    if (!bVar1) {
      this_local = time_buffer<r_exec::CInput,r_exec::CInput::IsInvalidated>::end_iterator;
      local_10 = DAT_002f8c18;
LAB_0028f695:
      iVar2._cell = (uintptr_t)local_10;
      iVar2.buffer = this_local;
      return iVar2;
    }
    this_00 = iterator::operator*((iterator *)local_40);
    bVar1 = r_exec::CInput::operator==(this_00,(CInput *)i._cell);
    if (bVar1) {
      this_local = (time_buffer<r_exec::CInput,_r_exec::CInput::IsInvalidated> *)local_40;
      local_10 = i.buffer;
      goto LAB_0028f695;
    }
    iterator::operator++((iterator *)local_40);
  } while( true );
}

Assistant:

iterator find(uint64_t time_reference, const T &t)
    {
        iterator i;

        for (i = begin(time_reference); i != end(); ++i) {
            if ((*i) == t) {
                return i;
            }
        }

        return end_iterator;
    }